

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall google::protobuf::UnknownFieldSet::DeleteByNumber(UnknownFieldSet *this,int number)

{
  uint32_t uVar1;
  int iVar2;
  reference pUVar3;
  Arena *pAVar4;
  reference pUVar5;
  UnknownField *field;
  int local_18;
  int i;
  int left;
  int number_local;
  UnknownFieldSet *this_local;
  
  local_18 = 0;
  for (field._4_4_ = 0; iVar2 = RepeatedField<google::protobuf::UnknownField>::size(&this->fields_),
      field._4_4_ < iVar2; field._4_4_ = field._4_4_ + 1) {
    pUVar3 = RepeatedField<google::protobuf::UnknownField>::operator[](&this->fields_,field._4_4_);
    iVar2 = UnknownField::number(pUVar3);
    if (iVar2 == number) {
      pAVar4 = arena(this);
      if (pAVar4 == (Arena *)0x0) {
        UnknownField::Delete(pUVar3);
      }
    }
    else {
      if (field._4_4_ != local_18) {
        pUVar3 = RepeatedField<google::protobuf::UnknownField>::operator[]
                           (&this->fields_,field._4_4_);
        pUVar5 = RepeatedField<google::protobuf::UnknownField>::operator[](&this->fields_,local_18);
        uVar1 = pUVar3->type_;
        pUVar5->number_ = pUVar3->number_;
        pUVar5->type_ = uVar1;
        pUVar5->data_ = pUVar3->data_;
      }
      local_18 = local_18 + 1;
    }
  }
  RepeatedField<google::protobuf::UnknownField>::Truncate(&this->fields_,local_18);
  return;
}

Assistant:

void UnknownFieldSet::DeleteByNumber(int number) {
  int left = 0;  // The number of fields left after deletion.
  for (int i = 0; i < fields_.size(); ++i) {
    UnknownField* field = &(fields_)[i];
    if (field->number() == number) {
      if (arena() == nullptr) {
        field->Delete();
      }
    } else {
      if (i != left) {
        (fields_)[left] = (fields_)[i];
      }
      ++left;
    }
  }
  fields_.Truncate(left);
}